

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playerhand_test.cpp
# Opt level: O2

Utest * __thiscall
TEST_PlayerHandTest_Sequence_TestShell::createTest(TEST_PlayerHandTest_Sequence_TestShell *this)

{
  TEST_PlayerHandTest_Sequence_Test *this_00;
  
  this_00 = (TEST_PlayerHandTest_Sequence_Test *)
            operator_new(0x60,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/playerhand_test.cpp"
                         ,0x47);
  TEST_PlayerHandTest_Sequence_Test::TEST_PlayerHandTest_Sequence_Test(this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(PlayerHandTest, Sequence)
{
	h.add(Tile::OneOfCircles);
	h.add(Tile::TwoOfCircles);
	h.add(Tile::ThreeOfCircles);

	h.bindSequence({
		Tile::OneOfCircles,
		Tile::TwoOfCircles,
		Tile::ThreeOfCircles
	});

	CHECK(!h.isClosedHand());
}